

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopTest.cpp
# Opt level: O0

int main(void)

{
  EventLoopFunc local_108;
  undefined1 local_e8 [8];
  EventLoop event_loop;
  
  higan::EventLoop::EventLoop((EventLoop *)local_e8);
  g_event_loop = (EventLoop *)local_e8;
  std::function<void()>::function<void(&)(),void>((function<void()> *)&local_108,PendingFunc);
  higan::EventLoop::RunInLoop((EventLoop *)local_e8,&local_108);
  std::function<void_()>::~function(&local_108);
  higan::EventLoop::Loop((EventLoop *)local_e8);
  higan::EventLoop::~EventLoop((EventLoop *)local_e8);
  return 0;
}

Assistant:

int main()
{

	higan::EventLoop event_loop;
	g_event_loop = &event_loop;

	event_loop.RunInLoop(PendingFunc);
	event_loop.Loop();
}